

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_adds_a_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((env->active_fpu).fpr + ws),
                        (long)*(char *)((env->active_fpu).fpr + wt));
  *(char *)((env->active_fpu).fpr + wd) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 1),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 1));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 1) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 2),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 2));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 2) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 3),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 3));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 3) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 4),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 4));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 4) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 5),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 5));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 5) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 6),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 6));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 6) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 7),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 7));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 7) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 8),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 8));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 8) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 9),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 9));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 9) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 10),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 10));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 10) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xb),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xb));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xb) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xc),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xc));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xc) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xd),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xd));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xd) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xe),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xe));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xe) = (char)iVar1;
  iVar1 = msa_adds_a_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xf),
                        (long)*(char *)((long)(env->active_fpu).fpr + lVar2 + 0xf));
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xf) = (char)iVar1;
  return;
}

Assistant:

void helper_msa_adds_a_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_adds_a_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_adds_a_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_adds_a_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_adds_a_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_adds_a_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_adds_a_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_adds_a_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_adds_a_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_adds_a_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_adds_a_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_adds_a_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_adds_a_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_adds_a_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_adds_a_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_adds_a_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_adds_a_df(DF_BYTE, pws->b[15], pwt->b[15]);
}